

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductData.cpp
# Opt level: O1

void __thiscall
OpticsParser::PerforatedGeometry::PerforatedGeometry
          (PerforatedGeometry *this,double spacingX,double spacingY,double dimensionX,
          double dimensionY,string *perforationType)

{
  pointer pcVar1;
  
  (this->super_ProductGeometry)._vptr_ProductGeometry =
       (_func_int **)&PTR__PerforatedGeometry_001dc528;
  this->spacingX = spacingX;
  this->spacingY = spacingY;
  this->dimensionX = dimensionX;
  this->dimensionY = dimensionY;
  (this->perforationType)._M_dataplus._M_p = (pointer)&(this->perforationType).field_2;
  pcVar1 = (perforationType->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->perforationType,pcVar1,pcVar1 + perforationType->_M_string_length);
  return;
}

Assistant:

OpticsParser::PerforatedGeometry::PerforatedGeometry(double spacingX,
                                                     double spacingY,
                                                     double dimensionX,
                                                     double dimensionY,
                                                     std::string perforationType) :
    spacingX(spacingX),
    spacingY(spacingY),
    dimensionX(dimensionX),
    dimensionY(dimensionY),
    perforationType(perforationType)
{}